

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtCore.cpp
# Opt level: O3

JsErrorCode
JsGetSharedArrayBufferContent
          (JsValueRef sharedArrayBuffer,JsSharedArrayBufferContentHandle *sharedContents)

{
  ScriptContext *scriptContext;
  SharedContents *this;
  code *pcVar1;
  bool bVar2;
  JsErrorCode JVar3;
  JsrtContext *currentContext;
  SharedArrayBuffer *pSVar4;
  undefined4 *puVar5;
  ScriptContext *__localScriptContext;
  void *unaff_retaddr;
  undefined1 auStack_98 [8];
  TTDebuggerAbortException anon_var_0;
  undefined1 local_58 [8];
  EnterScriptObject __enterScriptObject;
  AutoNestedHandledExceptionType __autoNestedHandledExceptionType;
  
  currentContext = JsrtContext::GetCurrent();
  JVar3 = CheckContext(currentContext,false,false);
  if (JVar3 != JsNoError) {
    return JVar3;
  }
  scriptContext =
       (((currentContext->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr;
  AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
            ((AutoNestedHandledExceptionType *)((long)&__enterScriptObject.library + 4),
             ExceptionType_JavascriptException|ExceptionType_OutOfMemory);
  anon_var_0.m_staticAbortMessage = (char16 *)0x0;
  anon_var_0.m_optEventTime = 0;
  anon_var_0.m_optMoveMode = 0;
  auStack_98 = (undefined1  [8])0x0;
  anon_var_0.m_abortCode = 0;
  anon_var_0._4_4_ = 0;
  Js::EnterScriptObject::EnterScriptObject
            ((EnterScriptObject *)local_58,scriptContext,(ScriptEntryExitRecord *)auStack_98,
             unaff_retaddr,&stack0x00000000,true,true,true);
  Js::ScriptContext::OnScriptStart(scriptContext,true,true);
  Js::EnterScriptObject::VerifyEnterScript((EnterScriptObject *)local_58);
  if (sharedContents == (JsSharedArrayBufferContentHandle *)0x0) {
    JVar3 = JsErrorNullArgument;
  }
  else {
    bVar2 = Js::VarIs<Js::SharedArrayBuffer>(sharedArrayBuffer);
    JVar3 = JsErrorInvalidArgument;
    if (bVar2) {
      pSVar4 = Js::VarTo<Js::SharedArrayBuffer>(sharedArrayBuffer);
      this = pSVar4->sharedContents;
      *sharedContents = this;
      if (this == (SharedContents *)0x0) {
        Js::EnterScriptObject::~EnterScriptObject((EnterScriptObject *)local_58);
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar5 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/Core/../JsrtInternal.h"
                           ,0xcc,
                           "(errCode != JsErrorFatal && errCode != JsErrorNoCurrentContext && errCode != JsErrorInExceptionState && errCode != JsErrorInDisabledState && errCode != JsErrorOutOfMemory && errCode != JsErrorScriptException && errCode != JsErrorScriptTerminated)"
                           ,
                           "errCode != JsErrorFatal && errCode != JsErrorNoCurrentContext && errCode != JsErrorInExceptionState && errCode != JsErrorInDisabledState && errCode != JsErrorOutOfMemory && errCode != JsErrorScriptException && errCode != JsErrorScriptTerminated"
                          );
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar5 = 0;
        JVar3 = JsErrorFatal;
        goto LAB_003c2ab2;
      }
      JVar3 = JsNoError;
      Js::SharedContents::AddRef(this);
    }
  }
  Js::EnterScriptObject::~EnterScriptObject((EnterScriptObject *)local_58);
LAB_003c2ab2:
  AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType
            ((AutoNestedHandledExceptionType *)((long)&__enterScriptObject.library + 4));
  return JVar3;
}

Assistant:

CHAKRA_API JsGetSharedArrayBufferContent(_In_ JsValueRef sharedArrayBuffer, _Out_ JsSharedArrayBufferContentHandle *sharedContents)
{
    return ContextAPIWrapper<JSRT_MAYBE_TRUE>([&](Js::ScriptContext *scriptContext, TTDRecorder& _actionEntryPopper) -> JsErrorCode {

        PARAM_NOT_NULL(sharedContents);

        if (!Js::VarIs<Js::SharedArrayBuffer>(sharedArrayBuffer))
        {
            return JsErrorInvalidArgument;
        }

        Js::SharedContents**& content = (Js::SharedContents**&)sharedContents;
        *content = Js::VarTo<Js::SharedArrayBuffer>(sharedArrayBuffer)->GetSharedContents();

        if (*content == nullptr)
        {
            return JsErrorFatal;
        }

        (*content)->AddRef();

        return JsNoError;
    });
}